

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

TypeRef * __thiscall ExpressionContext::GetReferenceType(ExpressionContext *this,TypeBase *type)

{
  uint uVar1;
  TypeBase **ppTVar2;
  int iVar3;
  undefined4 extraout_var;
  InplaceStr name;
  TypeRef *this_00;
  
  if (type != (TypeBase *)0x0) {
    if (type->typeID == 0x1b) {
LAB_0014b520:
      __assert_fail("!isType<TypeArgumentSet>(type) && !isType<TypeMemberSet>(type) && !isType<TypeFunctionSet>(type)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x68a,"TypeRef *ExpressionContext::GetReferenceType(TypeBase *)");
    }
    if (type != (TypeBase *)0x0) {
      if (type->typeID == 0x1c) goto LAB_0014b520;
      if (type != (TypeBase *)0x0) {
        if (type->typeID == 0x1a) goto LAB_0014b520;
        if ((type != (TypeBase *)0x0) && (type->typeID == 0)) {
          __assert_fail("!isType<TypeError>(type)",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x68b,"TypeRef *ExpressionContext::GetReferenceType(TypeBase *)");
        }
      }
    }
  }
  if (this->typeAuto == type) {
    __assert_fail("type != typeAuto",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x68e,"TypeRef *ExpressionContext::GetReferenceType(TypeBase *)");
  }
  this_00 = type->refType;
  if (this_00 == (TypeRef *)0x0) {
    iVar3 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x68);
    this_00 = (TypeRef *)CONCAT44(extraout_var,iVar3);
    name = GetReferenceTypeName(this,type);
    TypeRef::TypeRef(this_00,name,type);
    type->refType = this_00;
    uVar1 = (this->types).count;
    if (uVar1 == (this->types).max) {
      SmallArray<TypeBase_*,_128U>::grow(&this->types,uVar1);
    }
    ppTVar2 = (this->types).data;
    if (ppTVar2 == (TypeBase **)0x0) {
      __assert_fail("data",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x162,
                    "void SmallArray<TypeBase *, 128>::push_back(const T &) [T = TypeBase *, N = 128]"
                   );
    }
    uVar1 = (this->types).count;
    (this->types).count = uVar1 + 1;
    ppTVar2[uVar1] = (TypeBase *)this_00;
  }
  return this_00;
}

Assistant:

TypeRef* ExpressionContext::GetReferenceType(TypeBase* type)
{
	// Can't derive from pseudo types
	assert(!isType<TypeArgumentSet>(type) && !isType<TypeMemberSet>(type) && !isType<TypeFunctionSet>(type));
	assert(!isType<TypeError>(type));

	// Can't create reference to auto this way
	assert(type != typeAuto);

	if(type->refType)
		return type->refType;

	// Create new type
	TypeRef* result = new (get<TypeRef>()) TypeRef(GetReferenceTypeName(*this, type), type);

	// Save it for future use
	type->refType = result;

	types.push_back(result);

	return result;
}